

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cc
# Opt level: O1

bool __thiscall absl::lts_20240722::Barrier::Block(Barrier *this)

{
  int iVar1;
  int iVar2;
  Condition CStack_38;
  
  Mutex::Lock((Mutex *)this);
  iVar1 = *(int *)(this + 8);
  *(int *)(this + 8) = iVar1 + -1;
  if (0 < iVar1) {
    Condition::Condition(&CStack_38,IsZero,this + 8);
    Mutex::AwaitCommon((Mutex *)this,&CStack_38,(KernelTimeout)0xffffffffffffffff);
    iVar2 = *(int *)(this + 0xc);
    iVar1 = iVar2 + -1;
    *(int *)(this + 0xc) = iVar1;
    if (0 < iVar2) {
      Mutex::Unlock((Mutex *)this);
      return iVar1 == 0;
    }
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"barrier.cc",0x2b,"Check %s failed: %s","this->num_to_exit_ >= 0",
               "barrier underflow");
    Block();
  }
  absl::lts_20240722::raw_log_internal::RawLog
            (kFatal,"barrier.cc",0x24,
             "Block() called too many times.  num_to_block_=%d out of total=%d");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/synchronization/barrier.cc"
                ,0x24,"bool absl::Barrier::Block()");
}

Assistant:

bool Barrier::Block() {
  MutexLock l(&this->lock_);

  this->num_to_block_--;
  if (this->num_to_block_ < 0) {
    ABSL_RAW_LOG(
        FATAL,
        "Block() called too many times.  num_to_block_=%d out of total=%d",
        this->num_to_block_, this->num_to_exit_);
  }

  this->lock_.Await(Condition(IsZero, &this->num_to_block_));

  // Determine which thread can safely delete this Barrier object
  this->num_to_exit_--;
  ABSL_RAW_CHECK(this->num_to_exit_ >= 0, "barrier underflow");

  // If num_to_exit_ == 0 then all other threads in the barrier have
  // exited the Wait() and have released the Mutex so this thread is
  // free to delete the barrier.
  return this->num_to_exit_ == 0;
}